

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void sort_quests(int32 **qarr,int32 *nqfone,uint32 nfone,int32 *nquests)

{
  long lVar1;
  int32 *piVar2;
  int iVar3;
  void *ptr;
  void *ptr_00;
  long lVar4;
  ulong uVar5;
  int32 iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  ptr = __ckd_calloc__((long)*nquests,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x2d1);
  iVar3 = *nquests;
  if (0 < iVar3) {
    lVar7 = 1;
    lVar9 = 0;
    do {
      lVar1 = lVar9 + 1;
      lVar4 = (long)iVar3;
      lVar8 = lVar7;
      if (lVar1 < lVar4) {
        do {
          if (nqfone[lVar8] + nqfone[lVar9] == nfone) {
            ptr_00 = __ckd_calloc__((ulong)nfone,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x2d6);
            if (0 < nqfone[lVar9]) {
              piVar2 = qarr[lVar9];
              lVar4 = 0;
              do {
                *(undefined4 *)((long)ptr_00 + (long)piVar2[lVar4] * 4) = 1;
                lVar4 = lVar4 + 1;
              } while (lVar4 < nqfone[lVar9]);
            }
            iVar3 = nqfone[lVar8];
            if (0 < iVar3) {
              piVar2 = qarr[lVar8];
              lVar4 = 0;
              do {
                *(undefined4 *)((long)ptr_00 + (long)piVar2[lVar4] * 4) = 1;
                lVar4 = lVar4 + 1;
                iVar3 = nqfone[lVar8];
              } while (lVar4 < iVar3);
            }
            uVar5 = 0;
            if (nfone == 0) {
LAB_00104b13:
              if ((uint32)uVar5 == nfone) goto LAB_00104b17;
            }
            else {
              do {
                if (*(int *)((long)ptr_00 + uVar5 * 4) == 0) goto LAB_00104b13;
                uVar5 = uVar5 + 1;
              } while (nfone != uVar5);
LAB_00104b17:
              lVar4 = lVar8;
              if (iVar3 < nqfone[lVar9]) {
                lVar4 = lVar9;
              }
              *(undefined4 *)((long)ptr + lVar4 * 4) = 1;
            }
            ckd_free(ptr_00);
            iVar3 = *nquests;
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < iVar3);
        lVar4 = (long)iVar3;
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar1;
    } while (lVar1 < lVar4);
    if (0 < iVar3) {
      lVar9 = 0;
      iVar6 = 0;
      do {
        if (*(int *)((long)ptr + lVar9 * 4) == 1) {
          ckd_free(qarr[lVar9]);
        }
        else {
          qarr[iVar6] = qarr[lVar9];
          nqfone[iVar6] = nqfone[lVar9];
          iVar6 = iVar6 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < *nquests);
      goto LAB_00104ba7;
    }
  }
  iVar6 = 0;
LAB_00104ba7:
  *nquests = iVar6;
  ckd_free(ptr);
  return;
}

Assistant:

void   sort_quests(int32 **qarr, int32 *nqfone, uint32 nfone, int32 *nquests)
{
    int32  i, j, k;
    int32  *marker, *flag;

    marker = (int32 *) ckd_calloc(*nquests,sizeof(int32));

    for (i=0;i<*nquests;i++){
        for (j=i+1; j < *nquests; j++){
            if (nqfone[i]+nqfone[j] != nfone) continue;
            flag = (int32 *) ckd_calloc(nfone,sizeof(int32));
            for (k=0;k < nqfone[i];k++) flag[qarr[i][k]] = 1;
            for (k=0;k < nqfone[j];k++) flag[qarr[j][k]] = 1;
            for (k=0;k < nfone;k++) if (flag[k] == 0) break;
            if (k == nfone) { /* the two questions are complements */
                if (nqfone[i] > nqfone[j]) marker [i] = 1;
                else marker[j] = 1;
            }
            ckd_free((void *)flag);
        }
    }
    for (i=0,j=0;i<*nquests;i++){
        if (marker[i] == 1) {
            ckd_free((void *)qarr[i]);
            continue;
        }
        qarr[j] = qarr[i];
        nqfone[j] = nqfone[i];
        j++;
    }
    *nquests = j;
       
    ckd_free((void *) marker);
}